

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feebumper_tests.cpp
# Opt level: O1

void wallet::feebumper::feebumper_tests::external_max_weight_test_invoker(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  unit_test_log_t *puVar3;
  ios_base *this;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  external_max_weight_test t;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_bd0;
  char *local_bc8;
  char *local_bc0;
  char *local_bb8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_bb0;
  char *local_ba8;
  char *local_ba0;
  char *local_b98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b90;
  char *local_b88;
  char *local_b80;
  char *local_b78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b70;
  char *local_b68;
  char *local_b60;
  char *local_b58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b50;
  char *local_b48;
  char *local_b40;
  char *local_b38;
  undefined1 local_b30 [112];
  ios_base local_ac0 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b8;
  undefined1 local_998 [376];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_820 [62];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_b40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/feebumper_tests.cpp"
  ;
  local_b38 = "";
  memset((ostringstream *)local_998,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_998);
  local_820[0]._M_string_length = 0;
  local_820[0].field_2._M_local_buf[0] = '\0';
  local_b30[0] = (ostringstream)0x22;
  local_820[0]._M_dataplus._M_p = (pointer)&local_820[0].field_2;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_998,local_b30,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_998,"external_max_weight_test",0x18);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_998,"\" fixture ctor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (local_820,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b30);
  if ((undefined1 *)CONCAT71(local_b30._1_7_,local_b30[0]) != local_b30 + 0x10) {
    operator_delete((undefined1 *)CONCAT71(local_b30._1_7_,local_b30[0]),local_b30._16_8_ + 1);
  }
  local_b50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_820[0]._M_dataplus._M_p;
  local_b48 = local_820[0]._M_dataplus._M_p + local_820[0]._M_string_length;
  file.m_end = (iterator)0x2a;
  file.m_begin = (iterator)&local_b40;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file,(size_t)&local_b50,msg);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_820[0]._M_dataplus._M_p != &local_820[0].field_2) {
    operator_delete(local_820[0]._M_dataplus._M_p,
                    CONCAT71(local_820[0].field_2._M_allocated_capacity._1_7_,
                             local_820[0].field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_998);
  std::ios_base::~ios_base((ios_base *)(local_998 + 0x70));
  WalletTestingSetup::WalletTestingSetup((WalletTestingSetup *)local_998,MAIN);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_b60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/feebumper_tests.cpp"
  ;
  local_b58 = "";
  memset((ostringstream *)local_b30,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_b30);
  paVar1 = &local_9b8.field_2;
  local_9b8._M_string_length = 0;
  local_9b8.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_9b8._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_b30,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_b30,"external_max_weight_test",0x18);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_b30,"\" fixture setup",0xf);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_9b8,&local_58);
  paVar2 = &local_58.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_b70 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_9b8._M_dataplus._M_p;
  local_b68 = local_9b8._M_dataplus._M_p + local_9b8._M_string_length;
  file_00.m_end = (iterator)0x2a;
  file_00.m_begin = (iterator)&local_b60;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_00,(size_t)&local_b70,msg_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_9b8._M_dataplus._M_p,
                    CONCAT71(local_9b8.field_2._M_allocated_capacity._1_7_,
                             local_9b8.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_b30);
  std::ios_base::~ios_base(local_ac0);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_b80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/feebumper_tests.cpp"
  ;
  local_b78 = "";
  memset((ostringstream *)local_b30,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_b30);
  local_9b8._M_string_length = 0;
  local_9b8.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_9b8._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_b30,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_b30,"external_max_weight_test",0x18);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_b30,"\" test entry",0xc);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_9b8,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_b90 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_9b8._M_dataplus._M_p;
  local_b88 = local_9b8._M_dataplus._M_p + local_9b8._M_string_length;
  file_01.m_end = (iterator)0x2a;
  file_01.m_begin = (iterator)&local_b80;
  msg_01.m_end = in_R9;
  msg_01.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_01,(size_t)&local_b90,msg_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_9b8._M_dataplus._M_p,
                    CONCAT71(local_9b8.field_2._M_allocated_capacity._1_7_,
                             local_9b8.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_b30);
  this = local_ac0;
  std::ios_base::~ios_base(this);
  external_max_weight_test::test_method((external_max_weight_test *)this);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_ba0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/feebumper_tests.cpp"
  ;
  local_b98 = "";
  memset((ostringstream *)local_b30,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_b30);
  local_9b8._M_string_length = 0;
  local_9b8.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_9b8._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_b30,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_b30,"external_max_weight_test",0x18);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_b30,"\" fixture teardown",0x12);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_9b8,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_bb0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_9b8._M_dataplus._M_p;
  local_ba8 = local_9b8._M_dataplus._M_p + local_9b8._M_string_length;
  file_02.m_end = (iterator)0x2a;
  file_02.m_begin = (iterator)&local_ba0;
  msg_02.m_end = in_R9;
  msg_02.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_02,(size_t)&local_bb0,msg_02);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_9b8._M_dataplus._M_p,
                    CONCAT71(local_9b8.field_2._M_allocated_capacity._1_7_,
                             local_9b8.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_b30);
  std::ios_base::~ios_base(local_ac0);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_bc0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/feebumper_tests.cpp"
  ;
  local_bb8 = "";
  memset((ostringstream *)local_b30,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_b30);
  local_9b8._M_string_length = 0;
  local_9b8.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_9b8._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_b30,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_b30,"external_max_weight_test",0x18);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_b30,"\" fixture dtor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_9b8,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_bd0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_9b8._M_dataplus._M_p;
  local_bc8 = local_9b8._M_dataplus._M_p + local_9b8._M_string_length;
  file_03.m_end = (iterator)0x2a;
  file_03.m_begin = (iterator)&local_bc0;
  msg_03.m_end = in_R9;
  msg_03.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_03,(size_t)&local_bd0,msg_03);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_9b8._M_dataplus._M_p,
                    CONCAT71(local_9b8.field_2._M_allocated_capacity._1_7_,
                             local_9b8.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_b30);
  std::ios_base::~ios_base(local_ac0);
  WalletTestingSetup::~WalletTestingSetup((WalletTestingSetup *)local_998);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(external_max_weight_test)
{
    // P2PKH
    CheckMaxWeightComputation("453042021f03c8957c5ce12940ee6e3333ecc3f633d9a1ac53a55b3ce0351c617fa96abe021f0dccdcce3ef45a63998be9ec748b561baf077b8e862941d0cd5ec08f5afe68012102fccfeb395f0ecd3a77e7bc31c3bc61dc987418b18e395d441057b42ca043f22c", {}, "76a914f60dcfd3392b28adc7662669603641f578eed72d88ac", 593);
    // P2SH-P2WPKH
    CheckMaxWeightComputation("160014001dca1b22c599b5a56a87c78417ad2ff39552f1", {"3042021f5443c58eaf45f3e5ef46f8516f966b334a7d497cedda4edb2b9fad57c90c3b021f63a77cb56cde848e2e2dd20b487eec2f53101f634193786083f60b4d23a82301", "026cfe86116f161057deb240201d6b82ebd4f161e0200d63dc9aca65a1d6b38bb7"}, "a9147c8ab5ad7708b97ccb6b483d57aba48ee85214df87", 364);
    // P2WPKH
    CheckMaxWeightComputation("", {"3042021f0f8906f0394979d5b737134773e5b88bf036c7d63542301d600ab677ba5a59021f0e9fe07e62c113045fa1c1532e2914720e8854d189c4f5b8c88f57956b704401", "0359edba11ed1a0568094a6296a16c4d5ee4c8cfe2f5e2e6826871b5ecf8188f79"}, "00149961a78658030cc824af4c54fbf5294bec0cabdd", 272);
    // P2WSH HTLC
    CheckMaxWeightComputation("", {"3042021f5c4c29e6b686aae5b6d0751e90208592ea96d26bc81d78b0d3871a94a21fa8021f74dc2f971e438ccece8699c8fd15704c41df219ab37b63264f2147d15c34d801", "01", "6321024cf55e52ec8af7866617dc4e7ff8433758e98799906d80e066c6f32033f685f967029000b275210214827893e2dcbe4ad6c20bd743288edad21100404eb7f52ccd6062fd0e7808f268ac"}, "002089e84892873c679b1129edea246e484fd914c2601f776d4f2f4a001eb8059703", 318);
}